

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skiplist.cpp
# Opt level: O3

bool __thiscall Skiplist::put(Skiplist *this,uint64_t k,string *v,bool d)

{
  size_t *psVar1;
  Quadlistnode *pQVar2;
  bool bVar3;
  uint uVar4;
  Quadlist *pQVar5;
  _List_node_base *p_Var6;
  Quadlistnode *b;
  _List_node_base *p_Var7;
  _List_iterator<Quadlist_*> __tmp;
  Quadlistnode *p;
  Entry *e_00;
  _List_node_base *p_Var8;
  reverse_iterator temp;
  Entry e;
  iterator qlist;
  Quadlistnode *local_68;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  iterator local_38;
  
  Entry::Entry((Entry *)local_60);
  local_60 = (undefined1  [8])k;
  std::__cxx11::string::_M_assign((string *)&local_58);
  local_38._M_node =
       (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
       super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if (local_38._M_node == (_List_node_base *)this) {
    pQVar5 = (Quadlist *)operator_new(0x18);
    Quadlist::init(pQVar5,(EVP_PKEY_CTX *)v);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)pQVar5;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
              super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    local_38._M_node =
         (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
         super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
  }
  local_68 = (Quadlistnode *)(local_38._M_node[1]._M_next)->_M_prev[3]._M_prev;
  bVar3 = skipSearch1(this,&local_38,&local_68,k);
  p = local_68;
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&(local_68->entry).value);
    while( true ) {
      p->del = d;
      p = p->below;
      if (p == (Quadlistnode *)0x0) break;
      std::__cxx11::string::_M_assign((string *)&(p->entry).value);
    }
  }
  else {
    e_00 = (Entry *)local_60;
    b = Quadlist::insertAfterAbove
                  ((Quadlist *)
                   (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                   super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                   super__List_node_base._M_prev[1]._M_next,e_00,local_68,(Quadlistnode *)0x0,d);
    p_Var6 = (_List_node_base *)this;
    while( true ) {
      uVar4 = rand();
      if ((uVar4 & 1) == 0) break;
      p_Var7 = p_Var6->_M_prev;
      if (p != (Quadlistnode *)0x0) {
        pQVar2 = (Quadlistnode *)p_Var7[1]._M_next[1]._M_next;
        if (pQVar2 != p) {
          while ((Quadlistnode *)(p_Var7[1]._M_next)->_M_prev != p) {
            if (p->above != (Quadlistnode *)0x0) {
              p_Var8 = (_List_node_base *)&p->above;
              p_Var6 = p_Var7;
              goto LAB_00104deb;
            }
            p = p->pred;
            if ((p == (Quadlistnode *)0x0) || (pQVar2 == p)) break;
          }
        }
      }
      if (p_Var7 == (this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                    super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node.
                    super__List_node_base._M_next) {
        pQVar5 = (Quadlist *)operator_new(0x18);
        Quadlist::init(pQVar5,(EVP_PKEY_CTX *)e_00);
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = (_List_node_base *)pQVar5;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar1 = &(this->super_list<Quadlist_*,_std::allocator<Quadlist_*>_>).
                  super__List_base<Quadlist_*,_std::allocator<Quadlist_*>_>._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        p_Var8 = (_List_node_base *)&pQVar5->header->succ->pred;
        p_Var6 = p_Var6->_M_prev;
      }
      else {
        p_Var8 = (p_Var7->_M_prev[1]._M_next)->_M_prev[3]._M_prev + 3;
        p_Var6 = p_Var7;
      }
LAB_00104deb:
      p = (Quadlistnode *)p_Var8->_M_next;
      e_00 = (Entry *)local_60;
      b = Quadlist::insertAfterAbove((Quadlist *)p_Var6->_M_prev[1]._M_next,e_00,p,b,d);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool Skiplist::put(uint64_t k,const std::string &v,bool d) {
    Entry e;

    e.key=k;
    e.value=v;


    if(empty())
    {
        Quadlist * bottomm = new Quadlist();
        push_front(bottomm);

    }

    list::iterator qlist=begin();   //顶层那条四联表  用迭代器！！！
    Quadlistnode * p=(*qlist)->first();//顶层四联表的第一个元素

    //如果找到这个元素 改变他的值 为v
    //memtable里的k不重复 插入相同k直接覆盖
    if(skipSearch1(qlist,p,k))  //这里传的都是引用哦！！
    {
//        big-=p->entry.value.size();
      //  big+=v.size();
        p->entry.value=v;
        p->del=d;
        while (p->below)
        {
            p=p->below;
            p->entry.value=v;
            p->del=d;
        }
        return true;

    }


    //skipSearch之后 如果没找到 qlist就是底层，p是比k小的最大的那个
    list::reverse_iterator r_qlist=rbegin();
    Quadlistnode * b = (*r_qlist)->insertAfterAbove(e,p,nullptr,d); //新底座
    while(rand()&1)
    {
        //找到这条链比k小的 并且头上有东西的
        while ((*r_qlist)->valid(p) && !p->above) p=p->pred;

        //如果pred是header 就说明 比k小的没有这么高的了
        if(!(*r_qlist)->valid(p))
        {
            reverse_iterator temp =r_qlist;
            temp++;
            if(temp==rend()) //说明是顶层了
            {
                //新建一层
                Quadlist * newTop = new Quadlist();
                push_front(newTop);

                p=newTop->first()->pred;
            } else {
                reverse_iterator temp = r_qlist;
                temp++;
                p = (*temp)->first()->pred;  //让p等于上一层的header (private)}
            }

        }
        else{
            p=p->above;
        }

        r_qlist++;//上升一层
        b= (*r_qlist)->insertAfterAbove(e,p,b,d);
    }


    return true;
}